

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  int in_EDI;
  Communicator client;
  int port;
  string ip;
  anon_class_1_0_00000001 *__f;
  function<unsigned_short_(const_char_*,_unsigned_int)> *this;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  function<void_()> *in_stack_ffffffffffffff40;
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  anon_class_1_0_00000001 local_70 [32];
  Communicator local_50 [8];
  uint local_48;
  undefined1 local_31;
  duration<long,_std::ratio<1L,_1000L>_> local_30 [4];
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s ip port\n",*in_RSI);
  if (local_8 < 3) {
    return -1;
  }
  this = (function<unsigned_short_(const_char_*,_unsigned_int)> *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"127.0.0.1",(allocator *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_48 = 0x2ee3;
  if (1 < local_8) {
    std::__cxx11::string::operator=((string *)local_30,(char *)local_10[1]);
  }
  if (2 < local_8) {
    local_48 = atoi((char *)local_10[2]);
  }
  uVar1 = std::__cxx11::string::c_str();
  printf("Connecting to %s : %d\n",uVar1,(ulong)local_48);
  GGSock::Communicator::Communicator(local_50,false);
  __f = local_70;
  std::function<unsigned_short(char_const*,unsigned_int)>::function<main::__0,void>(this,__f);
  GGSock::Communicator::setMessageCallback((ushort)local_50,(function *)0x5f);
  std::function<unsigned_short_(const_char_*,_unsigned_int)>::~function
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)0x10349d);
  std::function<unsigned_short(char_const*,unsigned_int)>::function<main::__1,void>(this,__f);
  GGSock::Communicator::setMessageCallback((ushort)local_50,(function *)0x5e);
  std::function<unsigned_short_(const_char_*,_unsigned_int)>::~function
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)0x1034d4);
  __rtime = local_30;
  std::function<void()>::operator=
            (in_stack_ffffffffffffff40,
             (anon_class_24_3_9716566c *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  do {
    update();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffff40,
               (int *)&stack0xffffffffffffff3c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s ip port\n", argv[0]);
    if (argc < 3) {
        return -1;
    }

    std::string ip = "127.0.0.1";
    int port = 12003;

    if (argc > 1) ip = argv[1];
    if (argc > 2) port = atoi(argv[2]);

    printf("Connecting to %s : %d\n", ip.c_str(), port);

    GGSock::Communicator client(false);

    client.setMessageCallback(95, [](const char * , size_t ) {
        printf("Received message 95\n");
        return 0;
    });
    client.setMessageCallback(94, [](const char * , size_t dataSize) {
        printf("Received message 94, dataSize = %d\n", (int) dataSize);
        return 0;
    });

    g_update = [&]() {
        if (client.connect(ip, port, 0)) {
            printf("Started connecting ...\n");
        }

        if (client.isConnected()) {
            client.send(195);
        }

        client.update();
    };


#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop(update, 0, 1);
#else
    while(true) {
        update();
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
#endif

    return 0;
}